

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O0

bool __thiscall ON_3dmConstructionPlane::Read(ON_3dmConstructionPlane *this,ON_BinaryArchive *file)

{
  bool local_21;
  int local_20;
  int iStack_1c;
  bool rc;
  int minor_version;
  int major_version;
  ON_BinaryArchive *file_local;
  ON_3dmConstructionPlane *this_local;
  
  _minor_version = file;
  file_local = (ON_BinaryArchive *)this;
  Default(this);
  iStack_1c = 0;
  local_20 = 0;
  local_21 = ON_BinaryArchive::Read3dmChunkVersion
                       (_minor_version,&stack0xffffffffffffffe4,&local_20);
  if ((local_21) && (iStack_1c == 1)) {
    if (local_21) {
      local_21 = ON_BinaryArchive::ReadPlane(_minor_version,&this->m_plane);
    }
    if (local_21 != false) {
      local_21 = ON_BinaryArchive::ReadDouble(_minor_version,&this->m_grid_spacing);
    }
    if (local_21 != false) {
      local_21 = ON_BinaryArchive::ReadDouble(_minor_version,&this->m_snap_spacing);
    }
    if (local_21 != false) {
      local_21 = ON_BinaryArchive::ReadInt(_minor_version,&this->m_grid_line_count);
    }
    if (local_21 != false) {
      local_21 = ON_BinaryArchive::ReadInt(_minor_version,&this->m_grid_thick_frequency);
    }
    if (local_21 != false) {
      local_21 = ON_BinaryArchive::ReadString(_minor_version,&this->m_name);
    }
    if ((0 < local_20) && (local_21 != false)) {
      local_21 = ON_BinaryArchive::ReadBool(_minor_version,&this->m_bDepthBuffer);
    }
  }
  return local_21;
}

Assistant:

bool ON_3dmConstructionPlane::Read( ON_BinaryArchive& file )
{
  Default();
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.Read3dmChunkVersion(&major_version,&minor_version);
  if (rc && major_version==1) 
  {
    if (rc) rc = file.ReadPlane(m_plane);
    if (rc) rc = file.ReadDouble(&m_grid_spacing);
    if (rc) rc = file.ReadDouble(&m_snap_spacing);
    if (rc) rc = file.ReadInt(&m_grid_line_count);
    if (rc) rc = file.ReadInt(&m_grid_thick_frequency);
    if (rc) rc = file.ReadString(m_name);

    if ( minor_version >= 1 )
    {
      if (rc) rc = file.ReadBool(&m_bDepthBuffer);
    }
  }
  return rc;
}